

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O3

void __thiscall
helics::NetworkCommsInterface::NetworkCommsInterface
          (NetworkCommsInterface *this,InterfaceTypes type,thread_generation threads)

{
  CommsInterface::CommsInterface(&this->super_CommsInterface,threads);
  (this->super_CommsInterface)._vptr_CommsInterface =
       (_func_int **)&PTR__NetworkCommsInterface_0054ce98;
  this->brokerPort = -1;
  this->PortNumber = (__atomic_base<int>)0xffffffff;
  this->autoPortNumber = true;
  this->useOsPortAllocation = false;
  this->appendNameToAddress = false;
  this->noAckConnection = false;
  this->encrypted = false;
  this->forceConnection = false;
  this->networkType = type;
  this->network = IPV4;
  this->hasBroker = (__atomic_base<bool>)0x0;
  this->maxRetries = 5;
  PortAllocator::PortAllocator(&this->openPorts);
  return;
}

Assistant:

NetworkCommsInterface::NetworkCommsInterface(gmlc::networking::InterfaceTypes type,
                                             CommsInterface::thread_generation threads) noexcept:
    CommsInterface(threads), networkType(type)
{
}